

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border_offset.cpp
# Opt level: O1

size_t cppurses::detail::Border_offset::west(Widget *w)

{
  size_t sVar1;
  
  if ((((w->border).enabled_ != true) || (w->outer_width_ < 2)) ||
     ((sVar1 = 1, (w->border).segments.west.enabled_ == false &&
      (((w->border).segments.north_west.enabled_ == false &&
       ((w->border).segments.south_west.enabled_ == false)))))) {
    sVar1 = 0;
  }
  return sVar1;
}

Assistant:

std::size_t Border_offset::west(const Widget& w) {
    const auto& b = w.border.segments;
    if (w.border.enabled() && !west_disqualified(w) &&
        (b.west.enabled() || b.north_west.enabled() ||
         b.south_west.enabled())) {
        return 1;
    }
    return 0;
}